

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::VarConcat::VarConcat
          (VarConcat *this,shared_ptr<kratos::VarConcat> *first,shared_ptr<kratos::Var> *second)

{
  bool bVar1;
  initializer_list<const_kratos::IRNode_*> __l;
  int iVar2;
  int iVar3;
  element_type *left;
  element_type *right;
  element_type *peVar4;
  element_type *peVar5;
  bool *pbVar6;
  VarException *this_00;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  element_type *local_198;
  allocator<kratos::Var_*> local_189;
  __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
  local_188;
  __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
  local_180;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> local_178;
  undefined1 local_15a;
  allocator<const_kratos::IRNode_*> local_159;
  element_type *local_158;
  element_type *local_150;
  element_type **local_148;
  size_type local_140;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_138;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_120;
  char local_100 [32];
  string local_e0;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *local_b0;
  shared_ptr<kratos::Var> *second_local;
  shared_ptr<kratos::VarConcat> *first_local;
  VarConcat *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char (*local_48) [29];
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_b0 = &second->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
  second_local = (shared_ptr<kratos::Var> *)first;
  first_local = (shared_ptr<kratos::VarConcat> *)this;
  left = std::__shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>::get
                   (&first->super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>);
  right = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(local_b0);
  Expr::Expr(&this->super_Expr,(Var *)left,right);
  (this->super_Expr).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_00594778;
  std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::vector(&this->vars_);
  peVar4 = std::__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)second_local);
  bVar1 = (peVar4->super_Expr).super_Var.is_signed_;
  peVar5 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_b0);
  pbVar6 = Var::is_signed(peVar5);
  if ((bVar1 & 1U) != (*pbVar6 & 1U)) {
    local_15a = 1;
    this_00 = (VarException *)__cxa_allocate_exception(0x10);
    peVar4 = std::__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)second_local);
    (*(peVar4->super_Expr).super_Var.super_IRNode._vptr_IRNode[0x1f])(local_100);
    peVar5 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_b0);
    (*(peVar5->super_IRNode)._vptr_IRNode[0x1f])(&local_120);
    local_38 = &local_e0;
    local_40 = "{0} is signed but {1} is not";
    local_48 = (char (*) [29])local_100;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_120;
    fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string,char[29],char>
              (&local_78,(v7 *)"{0} is signed but {1} is not",local_48,
               (remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs,in_R8);
    local_58 = &local_78;
    local_88 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_58;
    local_20 = local_58;
    local_10 = local_58;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_58);
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_88.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_90.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_e0,(detail *)local_88.data_,format_str,args);
    local_158 = std::__shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2> *)
                           second_local);
    local_150 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(local_b0);
    local_148 = &local_158;
    local_140 = 2;
    std::allocator<const_kratos::IRNode_*>::allocator(&local_159);
    __l._M_len = local_140;
    __l._M_array = (iterator)local_148;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_138,__l,&local_159);
    VarException::VarException(this_00,&local_e0,&local_138);
    local_15a = 0;
    __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
  }
  peVar4 = std::__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)second_local);
  local_180._M_current =
       (Var **)std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::begin(&peVar4->vars_);
  peVar4 = std::__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)second_local);
  local_188._M_current =
       (Var **)std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::end(&peVar4->vars_);
  std::allocator<kratos::Var_*>::allocator(&local_189);
  std::vector<kratos::Var*,std::allocator<kratos::Var*>>::
  vector<__gnu_cxx::__normal_iterator<kratos::Var**,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>,void>
            ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)&local_178,local_180,local_188,
             &local_189);
  std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::operator=(&this->vars_,&local_178);
  std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::~vector(&local_178);
  std::allocator<kratos::Var_*>::~allocator(&local_189);
  local_198 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(local_b0);
  std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Var*>
            ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)&this->vars_,&local_198);
  peVar4 = std::__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)second_local);
  iVar2 = (*(peVar4->super_Expr).super_Var.super_IRNode._vptr_IRNode[7])();
  peVar5 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_b0);
  iVar3 = (*(peVar5->super_IRNode)._vptr_IRNode[7])();
  (this->super_Expr).super_Var.var_width_ = iVar2 + iVar3;
  (this->super_Expr).op = Concat;
  return;
}

Assistant:

VarConcat::VarConcat(const std::shared_ptr<VarConcat> &first, const std::shared_ptr<Var> &second)
    : Expr(first.get(), second.get()) {
    if (first->is_signed_ != second->is_signed())
        throw VarException(
            ::format("{0} is signed but {1} is not", first->to_string(), second->to_string()),
            {first.get(), second.get()});
    vars_ = std::vector<Var *>(first->vars_.begin(), first->vars_.end());
    vars_.emplace_back(second.get());
    var_width_ = first->width() + second->width();
    op = ExprOp::Concat;
}